

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh_tests.cpp
# Opt level: O0

void test<char_const**const&>(int argc,char ***argv)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  double __x;
  double __x_00;
  size_type local_268;
  int local_260;
  ExpressionDecomposer local_25c;
  Expression_lhs<int> local_258;
  Result local_250;
  undefined1 local_230 [8];
  ResultBuilder _DOCTEST_RB_1;
  int local_1b0;
  ExpressionDecomposer local_1ac;
  Expression_lhs<int> local_1a8;
  Result local_1a0;
  undefined1 local_170 [8];
  ResultBuilder _DOCTEST_RB;
  parser cmdl;
  char ***argv_local;
  int argc_local;
  
  argh::parser::parser((parser *)&_DOCTEST_RB.super_AssertData.m_exception_string,argc,*argv,1);
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_170,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp",
             0x1c7,"5 == cmdl.pos_args().size()","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1ac,DT_CHECK);
  local_1b0 = 5;
  local_1a8 = doctest::detail::ExpressionDecomposer::operator<<(&local_1ac,&local_1b0);
  this = argh::parser::pos_args_abi_cxx11_
                   ((parser *)&_DOCTEST_RB.super_AssertData.m_exception_string);
  _DOCTEST_RB_1.super_AssertData.m_exception_string =
       (char *)std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(this);
  doctest::detail::Expression_lhs<int>::operator==
            (&local_1a0,&local_1a8,
             (unsigned_long *)&_DOCTEST_RB_1.super_AssertData.m_exception_string);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_170,&local_1a0);
  doctest::detail::Result::~Result(&local_1a0);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_170,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_170);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_170);
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_230,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp",
             0x1c8,"2 == cmdl.flags().size()","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_25c,DT_CHECK);
  local_260 = 2;
  local_258 = doctest::detail::ExpressionDecomposer::operator<<(&local_25c,&local_260);
  this_00 = argh::parser::flags_abi_cxx11_
                      ((parser *)&_DOCTEST_RB.super_AssertData.m_exception_string);
  local_268 = std::
              multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00);
  doctest::detail::Expression_lhs<int>::operator==(&local_250,&local_258,&local_268);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_230,&local_250);
  doctest::detail::Result::~Result(&local_250);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_230,__x_00);
  if ((extraout_AL_00 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_230);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_230);
    argh::parser::~parser((parser *)&_DOCTEST_RB.super_AssertData.m_exception_string);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void test(int argc, T&& argv)
{
   auto cmdl = parser(argc, argv);
   CHECK(5 == cmdl.pos_args().size());
   CHECK(2 == cmdl.flags().size());
}